

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O3

void __thiscall MT32Emu::Synth::resetMasterTunePitchDelta(Synth *this)

{
  this->extensions->masterTunePitchDelta = 0;
  return;
}

Assistant:

void Synth::resetMasterTunePitchDelta() {
	// This effectively resets master tune to 440.0Hz.
	// Despite that the manual claims 442.0Hz is the default setting for master tune,
	// it doesn't actually take effect upon a reset due to a bug in the reset routine.
	// CONFIRMED: This bug is present in all supported Control ROMs.
	extensions.masterTunePitchDelta = 0;
#if MT32EMU_MONITOR_SYSEX > 0
	printDebug(" Actual Master Tune reset to 440.0");
#endif
}